

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

ATTRIBUTE_ID * getAttributeId(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  KEY name;
  STRING_POOL *pool;
  XML_Char XVar1;
  undefined1 *puVar2;
  int iVar3;
  XML_Char *pXVar4;
  ATTRIBUTE_ID *pAVar5;
  long lVar6;
  long lVar7;
  PREFIX *pPVar8;
  
  pool = (STRING_POOL *)((long)parser + 0x330);
  if ((*(long *)((long)parser + 0x348) != *(long *)((long)parser + 0x340)) ||
     (iVar3 = poolGrow(pool), iVar3 != 0)) {
    puVar2 = *(undefined1 **)((long)parser + 0x348);
    *(undefined1 **)((long)parser + 0x348) = puVar2 + 1;
    *puVar2 = 0;
    pXVar4 = poolStoreString(pool,enc,start,end);
    if (pXVar4 != (XML_Char *)0x0) {
      name = pXVar4 + 1;
      pAVar5 = (ATTRIBUTE_ID *)lookup((HASH_TABLE *)((long)parser + 0x2e0),name,0x18);
      if (pAVar5 != (ATTRIBUTE_ID *)0x0) {
        if (pAVar5->name != name) {
          *(undefined8 *)((long)parser + 0x348) = *(undefined8 *)((long)parser + 0x350);
          return pAVar5;
        }
        *(undefined8 *)((long)parser + 0x350) = *(undefined8 *)((long)parser + 0x348);
        if (*(int *)((long)parser + 0x1c8) == 0) {
          return pAVar5;
        }
        if ((((*name == 'x') && (pXVar4[2] == 'm')) && (pXVar4[3] == 'l')) &&
           ((pXVar4[4] == 'n' && (pXVar4[5] == 's')))) {
          if (pXVar4[6] == ':') {
            pPVar8 = (PREFIX *)lookup((HASH_TABLE *)((long)parser + 0x308),pXVar4 + 7,0x10);
LAB_004da1ee:
            pAVar5->prefix = pPVar8;
            pAVar5->xmlns = '\x01';
            return pAVar5;
          }
          if (pXVar4[6] == '\0') {
            pPVar8 = (PREFIX *)((long)parser + 0x390);
            goto LAB_004da1ee;
          }
        }
        lVar7 = 0;
        while( true ) {
          if (name[lVar7] == '\0') {
            return pAVar5;
          }
          if (name[lVar7] == ':') break;
          lVar7 = lVar7 + 1;
        }
        if (lVar7 != 0) {
          lVar6 = 0;
          do {
            if ((*(long *)((long)parser + 0x348) == *(long *)((long)parser + 0x340)) &&
               (iVar3 = poolGrow(pool), iVar3 == 0)) {
              return (ATTRIBUTE_ID *)0x0;
            }
            XVar1 = name[lVar6];
            pXVar4 = *(XML_Char **)((long)parser + 0x348);
            *(XML_Char **)((long)parser + 0x348) = pXVar4 + 1;
            *pXVar4 = XVar1;
            lVar6 = lVar6 + 1;
          } while (lVar7 != lVar6);
        }
        if ((*(long *)((long)parser + 0x348) != *(long *)((long)parser + 0x340)) ||
           (iVar3 = poolGrow(pool), iVar3 != 0)) {
          puVar2 = *(undefined1 **)((long)parser + 0x348);
          *(undefined1 **)((long)parser + 0x348) = puVar2 + 1;
          *puVar2 = 0;
          pPVar8 = (PREFIX *)
                   lookup((HASH_TABLE *)((long)parser + 0x308),*(KEY *)((long)parser + 0x350),0x10);
          pAVar5->prefix = pPVar8;
          if (pPVar8->name == *(KEY *)((long)parser + 0x350)) {
            *(undefined8 *)((long)parser + 0x350) = *(undefined8 *)((long)parser + 0x348);
            return pAVar5;
          }
          *(KEY *)((long)parser + 0x348) = *(KEY *)((long)parser + 0x350);
          return pAVar5;
        }
      }
    }
  }
  return (ATTRIBUTE_ID *)0x0;
}

Assistant:

static ATTRIBUTE_ID *
getAttributeId(XML_Parser parser, const ENCODING *enc, const char *start, const char *end)
{
  ATTRIBUTE_ID *id;
  const XML_Char *name;
  if (!poolAppendChar(&dtd.pool, XML_T('\0')))
    return 0;
  name = poolStoreString(&dtd.pool, enc, start, end);
  if (!name)
    return 0;
  ++name;
  id = (ATTRIBUTE_ID *)lookup(&dtd.attributeIds, name, sizeof(ATTRIBUTE_ID));
  if (!id)
    return 0;
  if (id->name != name)
    poolDiscard(&dtd.pool);
  else {
    poolFinish(&dtd.pool);
    if (!ns)
      ;
    else if (name[0] == 'x'
        && name[1] == 'm'
        && name[2] == 'l'
        && name[3] == 'n'
        && name[4] == 's'
        && (name[5] == XML_T('\0') || name[5] == XML_T(':'))) {
      if (name[5] == '\0')
        id->prefix = &dtd.defaultPrefix;
      else
        id->prefix = (PREFIX *)lookup(&dtd.prefixes, name + 6, sizeof(PREFIX));
      id->xmlns = 1;
    }
    else {
      int i;
      for (i = 0; name[i]; i++) {
        if (name[i] == XML_T(':')) {
          int j;
          for (j = 0; j < i; j++) {
            if (!poolAppendChar(&dtd.pool, name[j]))
              return 0;
          }
          if (!poolAppendChar(&dtd.pool, XML_T('\0')))
            return 0;
          id->prefix = (PREFIX *)lookup(&dtd.prefixes, poolStart(&dtd.pool), sizeof(PREFIX));
          if (id->prefix->name == poolStart(&dtd.pool))
            poolFinish(&dtd.pool);
          else
            poolDiscard(&dtd.pool);
          break;
        }
      }
    }
  }
  return id;
}